

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

OPJ_SIZE_T opj_tcd_get_encoder_input_buffer_size(opj_tcd_t *p_tcd)

{
  OPJ_SIZE_T OVar1;
  OPJ_INT32 *pOVar2;
  OPJ_UINT32 *pOVar3;
  OPJ_UINT32 OVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  OVar4 = p_tcd->image->numcomps;
  pOVar3 = &p_tcd->image->comps->prec;
  pOVar2 = &p_tcd->tcd_image->tiles->comps->y1;
  OVar1 = 0;
  while (bVar7 = OVar4 != 0, OVar4 = OVar4 - 1, bVar7) {
    uVar5 = ((*pOVar3 >> 3) + 1) - (uint)((*pOVar3 & 7) == 0);
    uVar6 = (ulong)uVar5;
    if (uVar5 == 3) {
      uVar6 = 4;
    }
    OVar1 = OVar1 + ((long)*pOVar2 - (long)pOVar2[-2]) *
                    ((long)pOVar2[-1] - (long)((opj_tcd_tilecomp_t *)(pOVar2 + -3))->x0) * uVar6;
    pOVar3 = pOVar3 + 0x10;
    pOVar2 = pOVar2 + 0x1c;
  }
  return OVar1;
}

Assistant:

OPJ_SIZE_T opj_tcd_get_encoder_input_buffer_size(opj_tcd_t *p_tcd)
{
    OPJ_UINT32 i;
    OPJ_SIZE_T l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    OPJ_UINT32 l_size_comp, l_remaining;

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;
    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        l_data_size += l_size_comp * ((OPJ_SIZE_T)(l_tilec->x1 - l_tilec->x0) *
                                      (OPJ_SIZE_T)(l_tilec->y1 - l_tilec->y0));
        ++l_img_comp;
        ++l_tilec;
    }

    return l_data_size;
}